

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

uchar * opus_tags_get_binary_suffix(OpusTags *_tags,int *_len)

{
  int iVar1;
  uchar *local_30;
  int local_24;
  int len;
  int ncomments;
  int *_len_local;
  OpusTags *_tags_local;
  
  iVar1 = _tags->comments;
  if (_tags->comment_lengths == (int *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = _tags->comment_lengths[iVar1];
  }
  *_len = local_24;
  if (local_24 < 1) {
    local_30 = (uchar *)0x0;
  }
  else {
    local_30 = (uchar *)_tags->user_comments[iVar1];
  }
  return local_30;
}

Assistant:

const unsigned char *opus_tags_get_binary_suffix(const OpusTags *_tags,
 int *_len){
  int ncomments;
  int len;
  ncomments=_tags->comments;
  len=_tags->comment_lengths==NULL?0:_tags->comment_lengths[ncomments];
  *_len=len;
  OP_ASSERT(len==0||_tags->user_comments!=NULL);
  return len>0?(const unsigned char *)_tags->user_comments[ncomments]:NULL;
}